

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O0

bool __thiscall GameBoard::winConditionSatisfied(GameBoard *this)

{
  int iVar1;
  bool bVar2;
  reference pQVar3;
  QString local_120;
  int local_108;
  int local_104;
  int j_2;
  int i_3;
  QString local_e8;
  int local_d0;
  int local_cc;
  int i_2;
  int matches;
  QString symbol;
  int local_94;
  undefined1 local_90 [4];
  int i_1;
  QString symbol_2;
  int matches_2;
  int j_1;
  QString local_60;
  int local_44;
  undefined1 local_40 [4];
  int j;
  QString symbol_1;
  int local_20;
  int matches_1;
  int i;
  int N;
  GameBoard *this_local;
  
  iVar1 = this->width_;
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    symbol_1.d.size._4_4_ = 1;
    pQVar3 = QList<QList<Field_*>_>::operator[](&this->grid_,(long)local_20);
    QList<Field_*>::operator[](pQVar3,0);
    QAbstractButton::text();
    for (local_44 = 1; local_44 < iVar1; local_44 = local_44 + 1) {
      pQVar3 = QList<QList<Field_*>_>::operator[](&this->grid_,(long)local_20);
      QList<Field_*>::operator[](pQVar3,(long)local_44);
      QAbstractButton::text();
      bVar2 = operator==(&local_60,(QString *)local_40);
      QString::~QString(&local_60);
      if (bVar2) {
        symbol_1.d.size._4_4_ = symbol_1.d.size._4_4_ + 1;
      }
    }
    if ((symbol_1.d.size._4_4_ == iVar1) &&
       (bVar2 = QString::operator!=((QString *)local_40,""), bVar2)) {
      this_local._7_1_ = 1;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    QString::~QString((QString *)local_40);
    if (bVar2) goto LAB_0010c0a3;
  }
  for (symbol_2.d.size._4_4_ = 0; symbol_2.d.size._4_4_ < iVar1;
      symbol_2.d.size._4_4_ = symbol_2.d.size._4_4_ + 1) {
    symbol_2.d.size._0_4_ = 1;
    pQVar3 = QList<QList<Field_*>_>::operator[](&this->grid_,0);
    QList<Field_*>::operator[](pQVar3,(long)symbol_2.d.size._4_4_);
    QAbstractButton::text();
    for (local_94 = 1; local_94 < iVar1; local_94 = local_94 + 1) {
      pQVar3 = QList<QList<Field_*>_>::operator[](&this->grid_,(long)local_94);
      QList<Field_*>::operator[](pQVar3,(long)symbol_2.d.size._4_4_);
      QAbstractButton::text();
      bVar2 = operator==((QString *)&symbol.d.size,(QString *)local_90);
      QString::~QString((QString *)&symbol.d.size);
      if (bVar2) {
        symbol_2.d.size._0_4_ = (int)symbol_2.d.size + 1;
      }
    }
    if (((int)symbol_2.d.size == iVar1) &&
       (bVar2 = QString::operator!=((QString *)local_90,""), bVar2)) {
      this_local._7_1_ = 1;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    QString::~QString((QString *)local_90);
    if (bVar2) goto LAB_0010c0a3;
  }
  pQVar3 = QList<QList<Field_*>_>::operator[](&this->grid_,0);
  QList<Field_*>::operator[](pQVar3,0);
  QAbstractButton::text();
  local_cc = 1;
  for (local_d0 = 1; local_d0 < iVar1; local_d0 = local_d0 + 1) {
    pQVar3 = QList<QList<Field_*>_>::operator[](&this->grid_,(long)local_d0);
    QList<Field_*>::operator[](pQVar3,(long)local_d0);
    QAbstractButton::text();
    bVar2 = operator==(&local_e8,(QString *)&i_2);
    QString::~QString(&local_e8);
    if (bVar2) {
      local_cc = local_cc + 1;
    }
  }
  if ((local_cc == iVar1) && (bVar2 = QString::operator!=((QString *)&i_2,""), bVar2)) {
    this_local._7_1_ = 1;
  }
  else {
    local_cc = 1;
    pQVar3 = QList<QList<Field_*>_>::operator[](&this->grid_,(long)(iVar1 + -1));
    QList<Field_*>::operator[](pQVar3,0);
    QAbstractButton::text();
    QString::operator=((QString *)&i_2,(QString *)&j_2);
    QString::~QString((QString *)&j_2);
    local_104 = iVar1 + -2;
    for (local_108 = 1; local_108 < iVar1; local_108 = local_108 + 1) {
      pQVar3 = QList<QList<Field_*>_>::operator[](&this->grid_,(long)local_104);
      QList<Field_*>::operator[](pQVar3,(long)local_108);
      QAbstractButton::text();
      bVar2 = operator==(&local_120,(QString *)&i_2);
      QString::~QString(&local_120);
      if (bVar2) {
        local_cc = local_cc + 1;
      }
      local_104 = local_104 + -1;
    }
    if ((local_cc == iVar1) && (bVar2 = QString::operator!=((QString *)&i_2,""), bVar2)) {
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  QString::~QString((QString *)&i_2);
LAB_0010c0a3:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GameBoard::winConditionSatisfied()
{
    // Check horizontally
    int N = width_; //Our application only works with square maps
    for(int i = 0; i < N; i++)
    {
        int matches = 1; // first symbol matches itself
        QString symbol = grid_[i][0]->text(); //Check if field holds X, O or is blank
        for(int j = 1; j < N; j++)
        {
            if(grid_[i][j]->text() == symbol)
                matches++;
        }
        if(matches == N && symbol != "")
            return true;
    }

    //Check vertically
    for(int j = 0; j < N; j++)
    {
        int matches = 1; // first symbol matches itself
        QString symbol = grid_[0][j]->text(); //Check if field holds X, O or is blank
        for(int i = 1; i < N; i++)
        {
            if(grid_[i][j]->text() == symbol)
                matches++;
        }
        if(matches == N && symbol != "")
            return true;
    }

    //Check diagonally
    //First check top left to bottom right:
    QString symbol = grid_[0][0]->text();
    int matches = 1;
    for(int i = 1; i < N; i++)
    {
        if(grid_[i][i]->text() == symbol)
            matches++;
    }
    if(matches == N && symbol != "")
        return true;

    //check bottom left to top right
    matches = 1;
    symbol = grid_[N-1][0]->text();
    for(int i = N-2, j = 1; j < N; i--, j++)
    {
        if(grid_[i][j]->text() == symbol)
            matches++;
    }
    if(matches == N && symbol != "")
        return true;

    return false; // If none of the previous checks returned true, win condition is not satisfied
}